

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O0

void __thiscall argparse::args_t::~args_t(args_t *this)

{
  long *in_RDI;
  
  if ((in_RDI[1] != 0) && (in_RDI[1] != _stdout)) {
    fclose((FILE *)in_RDI[1]);
  }
  if ((*in_RDI != 0) && (*in_RDI != _stdin)) {
    fclose((FILE *)*in_RDI);
  }
  if (in_RDI[2] != 0) {
    free((void *)in_RDI[2]);
  }
  return;
}

Assistant:

args_t::~args_t() {
        if ( output && output != stdout )
            fclose( output );
        
        if ( input && input != stdin)
            fclose ( input );
        
        if ( motif_list )
            free ( motif_list );
    }